

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_TestShell::
TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_TestShell
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_TestShell
           *this)

{
  TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_TestShell
  *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &
       PTR__TEST_MemoryLeakOverridesToBeUsedInProductionCode_UseNativeNewByTemporarlySwitchingOffNew_TestShell_00403008
  ;
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, UseNativeNewByTemporarlySwitchingOffNew)
{
#ifdef CPPUTEST_USE_NEW_MACROS
    #undef new
    #undef delete
#endif
    char* memory = new char[10];
    delete [] memory;
#ifdef CPPUTEST_USE_NEW_MACROS
    #include "CppUTest/MemoryLeakDetectorNewMacros.h"
#endif
}